

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_59 [33];
  string local_38;
  TestInfo *local_18;
  TestInfo *test_info_local;
  StreamingListener *this_local;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_59 + 1),"event=TestStart&name=",(allocator<char> *)__lhs);
  TestInfo::name(local_18);
  std::operator+(__lhs,(char *)this);
  SendLn(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    SendLn(std::string("event=TestStart&name=") + test_info.name());
  }